

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txid.cpp
# Opt level: O0

void __thiscall Txid_TxidEqualsUnMatch_Test::TestBody(Txid_TxidEqualsUnMatch_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_f8;
  AssertHelper local_d8;
  Message local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  string local_a8;
  undefined1 local_88 [8];
  Txid txid2;
  allocator local_51;
  string local_50;
  undefined1 local_30 [8];
  Txid txid1;
  Txid_TxidEqualsUnMatch_Test *this_local;
  
  txid1.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"1234567890123456789012345678901234567890123456789012345678901234",
             &local_51);
  cfd::core::Txid::Txid((Txid *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a8,"0234567890123456789012345678901234567890123456789012345678901234",
             (allocator *)((long)&gtest_ar_.message_.ptr_ + 7));
  cfd::core::Txid::Txid((Txid *)local_88,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  bVar1 = cfd::core::Txid::Equals((Txid *)local_30,(Txid *)local_88);
  local_c1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_c0,(AssertionResult *)"txid1.Equals(txid2)","true",
               "false",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_txid.cpp"
               ,0x3d,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  cfd::core::Txid::~Txid((Txid *)local_88);
  cfd::core::Txid::~Txid((Txid *)local_30);
  return;
}

Assistant:

TEST(Txid, TxidEqualsUnMatch) {
  Txid txid1 = Txid(
      "1234567890123456789012345678901234567890123456789012345678901234");
  Txid txid2 = Txid(
      "0234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_FALSE(txid1.Equals(txid2));
}